

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderInvarianceRule2Test::verifyResultData
          (TessellationShaderInvarianceRule2Test *this,void **all_iterations_data)

{
  ostringstream *poVar1;
  float fVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  pointer p_Var6;
  MessageBuilder *this_00;
  TestError *this_01;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  float *pfVar12;
  bool bVar13;
  bool ref_point_mode;
  bool cmp_point_mode;
  vector<glcts::_vertex,_std::allocator<glcts::_vertex>_> outer_vertices;
  float ref_inner_tess_levels [2];
  float cmp_inner_tess_levels [2];
  float ref_outer_tess_levels [4];
  float cmp_outer_tess_levels [4];
  _tessellation_shader_vertex_ordering ref_vertex_ordering;
  _tessellation_primitive_mode ref_primitive_mode;
  _tessellation_shader_vertex_ordering cmp_vertex_ordering;
  _tessellation_primitive_mode cmp_primitive_mode;
  string primitive_type;
  pointer local_1b8;
  _vertex vertex;
  ios_base local_138 [264];
  
  lVar8 = 0;
  do {
    pvVar3 = all_iterations_data[lVar8 * 2];
    pvVar4 = all_iterations_data[lVar8 * 2 + 1];
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (this->m_n_tessellated_vertices[lVar8 * 2] != 0) {
      uVar7 = 0;
      do {
        pfVar12 = (float *)((ulong)(uint)((int)uVar7 * 3) * 4 + (long)pvVar3);
        bVar5 = TessellationShaderUtils::isOuterEdgeVertex
                          (TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS - (lVar8 == 0),pfVar12);
        if (bVar5) {
          if (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            p_Var6 = outer_vertices.
                     super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              if ((((p_Var6->u == *pfVar12) && (!NAN(p_Var6->u) && !NAN(*pfVar12))) &&
                  (p_Var6->v == pfVar12[1])) && (!NAN(p_Var6->v) && !NAN(pfVar12[1]))) {
                if ((p_Var6->w == pfVar12[2]) && (!NAN(p_Var6->w) && !NAN(pfVar12[2])))
                goto LAB_00d39d07;
              }
              p_Var6 = p_Var6 + 1;
            } while (p_Var6 != outer_vertices.
                               super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
                               _M_impl.super__Vector_impl_data._M_finish);
          }
          vertex.u = pfVar12[0];
          vertex.v = pfVar12[1];
          vertex.w = pfVar12[2];
          if (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<glcts::_vertex,std::allocator<glcts::_vertex>>::
            _M_realloc_insert<glcts::_vertex_const&>
                      ((vector<glcts::_vertex,std::allocator<glcts::_vertex>> *)&outer_vertices,
                       (iterator)
                       outer_vertices.
                       super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
                       super__Vector_impl_data._M_finish,&vertex);
          }
          else {
            (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
             _M_impl.super__Vector_impl_data._M_finish)->w = vertex.w;
            (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
             _M_impl.super__Vector_impl_data._M_finish)->u = vertex.u;
            (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
             _M_impl.super__Vector_impl_data._M_finish)->v = vertex.v;
            outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
LAB_00d39d07:
        uVar7 = uVar7 + 1;
      } while (uVar7 < this->m_n_tessellated_vertices[lVar8 * 2]);
    }
    if (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
        super__Vector_impl_data._M_start !=
        outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      p_Var6 = outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if ((ulong)this->m_n_tessellated_vertices[lVar8 * 2 + 1] == 0) {
LAB_00d39df8:
          pcVar10 = "quads";
          if (lVar8 == 0) {
            pcVar10 = "triangles";
          }
          primitive_type._M_dataplus._M_p = (pointer)&primitive_type.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&primitive_type,pcVar10,pcVar10 + (ulong)(lVar8 == 0) * 4 + 5);
          (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[0xb])
                    (this,lVar8 * 2,ref_inner_tess_levels,ref_outer_tess_levels,&ref_point_mode,
                     &ref_primitive_mode,&ref_vertex_ordering,0);
          (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[0xb])
                    (this,lVar8 * 2 + 1U & 0xffffffff,cmp_inner_tess_levels,cmp_outer_tess_levels,
                     &cmp_point_mode,&cmp_primitive_mode,&cmp_vertex_ordering,0);
          vertex._0_8_ = ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.
                          super_TestCase.super_TestNode.m_testCtx)->m_log;
          pfVar12 = &vertex.w;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)pfVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pfVar12,"Outer vertex",0xc);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pfVar12," (",2);
          std::ostream::_M_insert<double>((double)p_Var6->u);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pfVar12,", ",2);
          std::ostream::_M_insert<double>((double)p_Var6->v);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pfVar12,", ",2);
          std::ostream::_M_insert<double>((double)p_Var6->w);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pfVar12,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pfVar12,
                     " was not found in tessellated data coordinate set generated",0x3b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pfVar12," for primitive type: ",0x15);
          local_1b8 = primitive_type._M_dataplus._M_p;
          this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)&vertex,&local_1b8);
          poVar1 = &this_00->m_str;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                     ". Reference inner tessellation level:",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," (",2);
          std::ostream::_M_insert<double>((double)ref_inner_tess_levels[0]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)ref_inner_tess_levels[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                     "), reference outer tessellation level:",0x26);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," (",2);
          std::ostream::_M_insert<double>((double)ref_outer_tess_levels[0]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)ref_outer_tess_levels[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)ref_outer_tess_levels[2]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)ref_outer_tess_levels[3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                     "), test inner tessellation level:",0x21);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," (",2);
          std::ostream::_M_insert<double>((double)cmp_inner_tess_levels[0]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)cmp_inner_tess_levels[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                     "), reference outer tessellation level:",0x26);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," (",2);
          std::ostream::_M_insert<double>((double)cmp_outer_tess_levels[0]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)cmp_outer_tess_levels[1]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)cmp_outer_tess_levels[2]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
          std::ostream::_M_insert<double>((double)cmp_outer_tess_levels[3]);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,").",2);
          tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)pfVar12);
          std::ios_base::~ios_base(local_138);
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,
                     "Outer edge vertex was not found in tessellated coordinate set generated for the same outer tessellation levels and vertex spacing, but different inner tessellation levels"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                     ,0x4e5);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        uVar9 = 0;
        bVar5 = false;
        uVar7 = 1;
        do {
          uVar11 = uVar9 & 0xffffffff;
          fVar2 = *(float *)((long)pvVar4 + uVar11 * 4);
          if (((fVar2 != p_Var6->u) || (NAN(fVar2) || NAN(p_Var6->u))) ||
             ((fVar2 = *(float *)((long)pvVar4 + uVar11 * 4 + 4), fVar2 != p_Var6->v ||
              (((NAN(fVar2) || NAN(p_Var6->v) ||
                (fVar2 = *(float *)((long)pvVar4 + uVar11 * 4 + 8), fVar2 != p_Var6->w)) ||
               (NAN(fVar2) || NAN(p_Var6->w))))))) {
            bVar13 = true;
          }
          else {
            bVar5 = true;
            bVar13 = false;
          }
          if (!bVar13) break;
          uVar9 = uVar9 + 3;
          bVar13 = uVar7 < this->m_n_tessellated_vertices[lVar8 * 2 + 1];
          uVar7 = uVar7 + 1;
        } while (bVar13);
        if (!bVar5) goto LAB_00d39df8;
        p_Var6 = p_Var6 + 1;
      } while (p_Var6 != outer_vertices.
                         super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl
                         .super__Vector_impl_data._M_finish);
    }
    if (outer_vertices.super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(outer_vertices.
                      super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)outer_vertices.
                            super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)outer_vertices.
                            super__Vector_base<glcts::_vertex,_std::allocator<glcts::_vertex>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    bVar5 = lVar8 != 0;
    lVar8 = lVar8 + 1;
    if (bVar5) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule2Test::verifyResultData(const void** all_iterations_data)
{
	/* Iterate through one tessellated set of vertices for a given primitive type
	 * and identify outer vertices. Make sure exactly the same vertices can be
	 * found in the other set of vertices, generated with different input tessellation
	 * level.
	 */
	for (int n_primitive_type = 0; n_primitive_type < 2; /* triangles / quads */
		 ++n_primitive_type)
	{
		const float*				 data1_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 0];
		const float*				 data2_ptr		= (const float*)all_iterations_data[n_primitive_type * 2 + 1];
		_tessellation_primitive_mode primitive_mode = (n_primitive_type == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
		std::vector<_vertex> outer_vertices;

		/* Iterate through all data1 vertices.. */
		for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2]; ++n_vertex)
		{
			/* Check if any of the components is equal to 0 or 1. If so, this could
			 * be an edge vertex.
			 */
			const float* vertex_ptr = data1_ptr + n_vertex * 3; /* components */

			if (TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, vertex_ptr))
			{
				/* Only add the vertex if it has not been added already to the vector */
				bool has_already_been_added = false;

				for (std::vector<_vertex>::const_iterator vertex_iterator = outer_vertices.begin();
					 vertex_iterator != outer_vertices.end(); vertex_iterator++)
				{
					if (vertex_iterator->u == vertex_ptr[0] && vertex_iterator->v == vertex_ptr[1] &&
						vertex_iterator->w == vertex_ptr[2])
					{
						has_already_been_added = true;

						break;
					}
				} /* for (all outer vertices stored so far) */

				if (!has_already_been_added)
				{
					_vertex vertex;

					vertex.u = vertex_ptr[0];
					vertex.v = vertex_ptr[1];
					vertex.w = vertex_ptr[2];

					outer_vertices.push_back(vertex);
				}
			} /* if (input vertex is located on outer edge) */
		}	 /* for (all input vertices) */

		DE_ASSERT(outer_vertices.size() != 0);

		/* Now that we know where outer vertices are, make sure they are present in the other data set */
		for (std::vector<_vertex>::const_iterator ref_vertex_iterator = outer_vertices.begin();
			 ref_vertex_iterator != outer_vertices.end(); ref_vertex_iterator++)
		{
			bool		   has_been_found = false;
			const _vertex& ref_vertex	 = *ref_vertex_iterator;

			for (unsigned int n_vertex = 0; n_vertex < m_n_tessellated_vertices[n_primitive_type * 2 + 1]; ++n_vertex)
			{
				const float* vertex_ptr = data2_ptr + n_vertex * 3; /* components */

				if (vertex_ptr[0] == ref_vertex.u && vertex_ptr[1] == ref_vertex.v && vertex_ptr[2] == ref_vertex.w)
				{
					has_been_found = true;

					break;
				}
			} /* for (all vertices in the other data set) */

			if (!has_been_found)
			{
				float								 cmp_inner_tess_levels[2];
				float								 cmp_outer_tess_levels[4];
				bool								 cmp_point_mode;
				_tessellation_primitive_mode		 cmp_primitive_mode;
				_tessellation_shader_vertex_ordering cmp_vertex_ordering;
				std::string							 primitive_type = (n_primitive_type == 0) ? "triangles" : "quads";
				float								 ref_inner_tess_levels[2];
				float								 ref_outer_tess_levels[4];
				bool								 ref_point_mode;
				_tessellation_primitive_mode		 ref_primitive_mode;
				_tessellation_shader_vertex_ordering ref_vertex_ordering;

				getIterationProperties(n_primitive_type * 2, ref_inner_tess_levels, ref_outer_tess_levels,
									   &ref_point_mode, &ref_primitive_mode, &ref_vertex_ordering, NULL);
				getIterationProperties(n_primitive_type * 2 + 1, cmp_inner_tess_levels, cmp_outer_tess_levels,
									   &cmp_point_mode, &cmp_primitive_mode, &cmp_vertex_ordering, NULL);

				m_testCtx.getLog() << tcu::TestLog::Message << "Outer vertex"
								   << " (" << ref_vertex.u << ", " << ref_vertex.v << ", " << ref_vertex.w << ")"
								   << " was not found in tessellated data coordinate set generated"
								   << " for primitive type: " << primitive_type.c_str()
								   << ". Reference inner tessellation level:"
								   << " (" << ref_inner_tess_levels[0] << ", " << ref_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << ref_outer_tess_levels[0] << ", " << ref_outer_tess_levels[1] << ", "
								   << ref_outer_tess_levels[2] << ", " << ref_outer_tess_levels[3]
								   << "), test inner tessellation level:"
								   << " (" << cmp_inner_tess_levels[0] << ", " << cmp_inner_tess_levels[1]
								   << "), reference outer tessellation level:"
								   << " (" << cmp_outer_tess_levels[0] << ", " << cmp_outer_tess_levels[1] << ", "
								   << cmp_outer_tess_levels[2] << ", " << cmp_outer_tess_levels[3] << ")."
								   << tcu::TestLog::EndMessage;

				TCU_FAIL("Outer edge vertex was not found in tessellated coordinate set generated for "
						 "the same outer tessellation levels and vertex spacing, but different inner "
						 "tessellation levels");
			} /* if (outer edge vertex was not found in the other set) */
		}	 /* for (all outer edge vertices) */
	}		  /* for (both primitive types) */
}